

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> __thiscall
wabt::MakeUnique<wabt::FuncImport,std::__cxx11::string&>
          (wabt *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  FuncImport *this_00;
  string_view local_28;
  string *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  
  local_18 = args;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  this_00 = (FuncImport *)operator_new(0x158);
  string_view::string_view(&local_28,local_18);
  FuncImport::FuncImport(this_00,local_28);
  std::unique_ptr<wabt::FuncImport,std::default_delete<wabt::FuncImport>>::
  unique_ptr<std::default_delete<wabt::FuncImport>,void>
            ((unique_ptr<wabt::FuncImport,std::default_delete<wabt::FuncImport>> *)this,this_00);
  return (__uniq_ptr_data<wabt::FuncImport,_std::default_delete<wabt::FuncImport>,_true,_true>)
         (__uniq_ptr_data<wabt::FuncImport,_std::default_delete<wabt::FuncImport>,_true,_true>)this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}